

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QList<QModelIndex> * __thiscall
QListModeViewBase::intersectingSet
          (QList<QModelIndex> *__return_storage_ptr__,QListModeViewBase *this,QRect *area)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  QListViewPrivate *pQVar6;
  int *piVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  Representation *pRVar11;
  int *piVar12;
  long lVar13;
  QRect *pQVar14;
  QRect *pQVar15;
  long lVar16;
  long in_FS_OFFSET;
  int local_78 [2];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  if (((this->super_QCommonListViewBase).dd)->flow == LeftToRight) {
    pQVar14 = (QRect *)&area->y1;
    pRVar11 = &area->y2;
    lVar10 = 8;
    pQVar15 = area;
  }
  else {
    pRVar11 = &area->x2;
    lVar10 = 0xc;
    pQVar14 = area;
    pQVar15 = (QRect *)&area->y1;
  }
  iVar1 = pRVar11->m_i;
  local_40 = (pQVar15->x1).m_i;
  local_3c = (pQVar14->x1).m_i;
  uVar5 = (this->segmentPositions).d.size;
  if ((1 < uVar5) && ((this->flowPositions).d.size != 0)) {
    iVar2 = *(int *)((long)&(area->x1).m_i + lVar10);
    iVar3 = (int)uVar5;
    iVar9 = qBinarySearch<int>(&this->segmentPositions,&local_3c,0,iVar3 + -1);
    lVar10 = (long)(iVar3 + -2);
    for (lVar13 = (long)iVar9;
        (lVar13 <= lVar10 && ((this->segmentPositions).d.ptr[lVar13] <= iVar1)); lVar13 = lVar13 + 1
        ) {
      if (local_40 <= (this->segmentExtents).d.ptr[lVar13]) {
        piVar7 = (this->segmentStartRows).d.ptr + lVar13 + 1;
        piVar12 = &(this->super_QCommonListViewBase).batchStartRow;
        if (lVar13 < lVar10) {
          piVar12 = piVar7;
        }
        iVar3 = *piVar12;
        iVar9 = qBinarySearch<int>(&this->flowPositions,&local_40,
                                   ((Representation *)(piVar7 + -1))->m_i,iVar3 + -1);
        for (lVar16 = (long)iVar9;
            (lVar16 < iVar3 && ((this->flowPositions).d.ptr[lVar16] <= iVar2)); lVar16 = lVar16 + 1)
        {
          bVar8 = QCommonListViewBase::isHidden(&this->super_QCommonListViewBase,(int)lVar16);
          if (!bVar8) {
            local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_58 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
            QCommonListViewBase::modelIndex
                      ((QModelIndex *)&local_58,&this->super_QCommonListViewBase,(int)lVar16);
            if (((-1 < (int)local_58) && (-1 < (long)local_58)) &&
               (local_48.ptr != (QAbstractItemModel *)0x0)) {
              pQVar6 = (this->super_QCommonListViewBase).dd;
              if ((pQVar6->flow != LeftToRight) &&
                 ((pQVar6->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i != 0)) {
                local_78[0] = -0x55555556;
                local_78[1] = 0xaaaaaaaa;
                uStack_70 = 0xaaaaaaaa;
                uStack_6c = 0xaaaaaaaa;
                local_68 = 0xaaaaaaaa;
                (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[3])
                          (local_78,this,(QModelIndex *)&local_58);
                piVar7 = (this->segmentPositions).d.ptr;
                iVar9 = piVar7[lVar13];
                iVar4 = piVar7[lVar13 + 1];
                if (iVar9 < local_3c) {
                  iVar9 = local_3c;
                }
                if (iVar1 <= iVar4) {
                  iVar4 = iVar1;
                }
                if ((iVar4 < local_78[0]) || (local_78[0] + (short)uStack_70 <= iVar9))
                goto LAB_005180ef;
              }
              QList<QModelIndex>::emplaceBack<QModelIndex_const&>
                        (__return_storage_ptr__,(QModelIndex *)&local_58);
            }
          }
LAB_005180ef:
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QModelIndex> QListModeViewBase::intersectingSet(const QRect &area) const
{
    QList<QModelIndex> ret;
    int segStartPosition;
    int segEndPosition;
    int flowStartPosition;
    int flowEndPosition;
    if (flow() == QListView::LeftToRight) {
        segStartPosition = area.top();
        segEndPosition = area.bottom();
        flowStartPosition = area.left();
        flowEndPosition = area.right();
    } else {
        segStartPosition = area.left();
        segEndPosition = area.right();
        flowStartPosition = area.top();
        flowEndPosition = area.bottom();
    }
    if (segmentPositions.size() < 2 || flowPositions.isEmpty())
        return ret;
    // the last segment position is actually the edge of the last segment
    const int segLast = segmentPositions.size() - 2;
    int seg = qBinarySearch<int>(segmentPositions, segStartPosition, 0, segLast + 1);
    for (; seg <= segLast && segmentPositions.at(seg) <= segEndPosition; ++seg) {
        int first = segmentStartRows.at(seg);
        int last = (seg < segLast ? segmentStartRows.at(seg + 1) : batchStartRow) - 1;
        if (segmentExtents.at(seg) < flowStartPosition)
            continue;
        int row = qBinarySearch<int>(flowPositions, flowStartPosition, first, last);
        for (; row <= last && flowPositions.at(row) <= flowEndPosition; ++row) {
            if (isHidden(row))
                continue;
            QModelIndex index = modelIndex(row);
            if (index.isValid()) {
                if (flow() == QListView::LeftToRight || dd->itemAlignment == Qt::Alignment()) {
                    ret += index;
                } else {
                    const auto viewItem = indexToListViewItem(index);
                    const int iw = viewItem.width();
                    const int startPos = qMax(segStartPosition, segmentPositions.at(seg));
                    const int endPos = qMin(segmentPositions.at(seg + 1), segEndPosition);
                    if (endPos >= viewItem.x && startPos < viewItem.x + iw)
                        ret += index;
                }
            }
#if 0 // for debugging
            else
                qWarning("intersectingSet: row %d was invalid", row);
#endif
        }
    }
    return ret;
}